

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

int xmlRemoveProp(xmlAttrPtr cur)

{
  _xmlNode *p_Var1;
  xmlAttrPtr pxVar2;
  _xmlAttr *p_Var3;
  xmlAttrPtr pxVar4;
  
  if (cur == (xmlAttrPtr)0x0) {
    return -1;
  }
  p_Var1 = cur->parent;
  if (p_Var1 == (_xmlNode *)0x0) {
    return -1;
  }
  pxVar2 = p_Var1->properties;
  if (p_Var1->properties == cur) {
    p_Var3 = cur->next;
    p_Var1->properties = p_Var3;
    if (p_Var3 == (_xmlAttr *)0x0) goto LAB_0014a403;
    pxVar4 = (xmlAttrPtr)0x0;
  }
  else {
    do {
      pxVar4 = pxVar2;
      if (pxVar4 == (xmlAttrPtr)0x0) {
        return -1;
      }
      pxVar2 = pxVar4->next;
    } while (pxVar4->next != cur);
    p_Var3 = cur->next;
    pxVar4->next = p_Var3;
    if (p_Var3 == (_xmlAttr *)0x0) goto LAB_0014a403;
  }
  p_Var3->prev = pxVar4;
LAB_0014a403:
  xmlFreeProp(cur);
  return 0;
}

Assistant:

int
xmlRemoveProp(xmlAttrPtr cur) {
    xmlAttrPtr tmp;
    if (cur == NULL) {
	return(-1);
    }
    if (cur->parent == NULL) {
	return(-1);
    }
    tmp = cur->parent->properties;
    if (tmp == cur) {
        cur->parent->properties = cur->next;
		if (cur->next != NULL)
			cur->next->prev = NULL;
	xmlFreeProp(cur);
	return(0);
    }
    while (tmp != NULL) {
	if (tmp->next == cur) {
	    tmp->next = cur->next;
	    if (tmp->next != NULL)
		tmp->next->prev = tmp;
	    xmlFreeProp(cur);
	    return(0);
	}
        tmp = tmp->next;
    }
    return(-1);
}